

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinViewportScale::emulate_mthd(MthdKelvinViewportScale *this)

{
  _Bool _Var1;
  uint32_t local_14;
  uint32_t err;
  MthdKelvinViewportScale *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  _Var1 = pgraph_in_begin_end(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    local_14 = 4;
  }
  if (local_14 == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type == 0x20) {
        pgraph_ld_xfctx(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x3a,
                        *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914,
                        (this->super_SingleMthdTest).super_MthdTest.val);
      }
      else {
        pgraph_ld_ltctx(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x37,
                        *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914,
                        (this->super_SingleMthdTest).super_MthdTest.val);
        pgraph_ld_xfctx(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x76,
                        *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914,
                        (this->super_SingleMthdTest).super_MthdTest.val);
      }
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				if (chipset.card_type == 0x20) {
					pgraph_ld_xfctx(&exp, 0x3a, idx, val);
				} else {
					pgraph_ld_ltctx(&exp, 0x37, idx, val);
					pgraph_ld_xfctx(&exp, 0x76, idx, val);
				}
			}
		}
	}